

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlChar * xmlSchemaGetComponentDesignation(xmlChar **buf,void *item)

{
  xmlChar *pxVar1;
  xmlChar *add;
  char *add_00;
  xmlChar *local_28;
  
  local_28 = (xmlChar *)0x0;
  pxVar1 = *buf;
  if (*item == XML_SCHEMA_TYPE_BASIC) {
    add_00 = "simple type definition";
    if (*(int *)((long)item + 0xa0) == 0x2d) {
      add_00 = "complex type definition";
    }
  }
  else {
    add_00 = (char *)xmlSchemaItemTypeToStr(*item);
  }
  pxVar1 = xmlStrcat(pxVar1,(xmlChar *)add_00);
  *buf = pxVar1;
  pxVar1 = xmlStrcat(pxVar1," \'");
  *buf = pxVar1;
  add = xmlSchemaGetComponentQName(&local_28,item);
  pxVar1 = xmlStrcat(pxVar1,add);
  *buf = pxVar1;
  pxVar1 = xmlStrcat(pxVar1,"\'");
  *buf = pxVar1;
  if (local_28 != (xmlChar *)0x0) {
    (*xmlFree)(local_28);
    pxVar1 = *buf;
  }
  return pxVar1;
}

Assistant:

static const xmlChar*
xmlSchemaGetComponentDesignation(xmlChar **buf, void *item)
{
    xmlChar *str = NULL;

    *buf = xmlStrcat(*buf, WXS_ITEM_TYPE_NAME(item));
    *buf = xmlStrcat(*buf, BAD_CAST " '");
    *buf = xmlStrcat(*buf, xmlSchemaGetComponentQName(&str,
	(xmlSchemaBasicItemPtr) item));
    *buf = xmlStrcat(*buf, BAD_CAST "'");
    FREE_AND_NULL(str);
    return(*buf);
}